

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cpp
# Opt level: O2

bool MeCab::Dictionary::compile
               (Param *param,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *dics,char *output)

{
  pointer pbVar1;
  ofstream *poVar2;
  pointer ppVar3;
  pointer ppVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ostream *poVar12;
  POSIDGenerator *p;
  long *plVar13;
  size_t sVar14;
  size_t sVar15;
  DecoderFeatureIndex *this;
  CharProperty *this_00;
  DictionaryRewriter *pDVar16;
  ContextID *this_01;
  undefined2 *puVar17;
  _Rb_tree_header *p_Var18;
  Node *node_00;
  int extraout_EDX;
  int extraout_EDX_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  pointer str_00;
  ulong uVar19;
  char *pcVar20;
  DecoderFeatureIndex *fi;
  size_t i_1;
  long lVar21;
  size_t i;
  CharProperty *local_9a8;
  Writer *local_9a0;
  Lattice *local_998;
  StringBuffer *local_988;
  uint dummy;
  ofstream *local_978;
  uint local_970;
  int type;
  vector<const_char_*,_std::allocator<const_char_*>_> str;
  string prev;
  vector<int,_std::allocator<int>_> val;
  scoped_ptr<MeCab::DictionaryRewriter> rewrite;
  uint lexsize;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
  dic;
  scoped_ptr<MeCab::ContextID> cid;
  string tbuf;
  vector<unsigned_long,_std::allocator<unsigned_long>_> len;
  long local_878;
  Iconv config_iconv;
  uint version;
  uint fsize;
  uint tsize;
  uint dsize;
  uint rsize;
  uint lsize;
  char charset [32];
  Iconv iconv;
  scoped_ptr<MeCab::POSIDGenerator> posid;
  string from;
  string dicdir;
  string fbuf;
  string config_charset;
  string node_format;
  string to;
  ofstream bofs;
  undefined4 uStack_714;
  size_type sStack_710;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_708;
  byte abStack_6f8 [496];
  DoubleArray da;
  string rewrite_file;
  string right_id_file;
  string left_id_file;
  Node node;
  string pos_id_file;
  string matrix_bin_file;
  string matrix_file;
  Connector matrix;
  istringstream iss;
  
  Connector::Connector(&matrix);
  rewrite._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_001390a0;
  rewrite.ptr_ = (DictionaryRewriter *)0x0;
  posid._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_001390d0;
  posid.ptr_ = (POSIDGenerator *)0x0;
  cid._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00139100;
  cid.ptr_ = (ContextID *)0x0;
  Param::get<std::__cxx11::string>(&dicdir,param,"dicdir");
  std::__cxx11::string::string((string *)&bofs,"matrix.def",(allocator *)&iss);
  create_filename(&matrix_file,&dicdir,(string *)&bofs);
  std::__cxx11::string::~string((string *)&bofs);
  std::__cxx11::string::string((string *)&bofs,"matrix.bin",(allocator *)&iss);
  create_filename(&matrix_bin_file,&dicdir,(string *)&bofs);
  std::__cxx11::string::~string((string *)&bofs);
  std::__cxx11::string::string((string *)&bofs,"left-id.def",(allocator *)&iss);
  create_filename(&left_id_file,&dicdir,(string *)&bofs);
  std::__cxx11::string::~string((string *)&bofs);
  std::__cxx11::string::string((string *)&bofs,"right-id.def",(allocator *)&iss);
  create_filename(&right_id_file,&dicdir,(string *)&bofs);
  std::__cxx11::string::~string((string *)&bofs);
  std::__cxx11::string::string((string *)&bofs,"rewrite.def",(allocator *)&iss);
  create_filename(&rewrite_file,&dicdir,(string *)&bofs);
  std::__cxx11::string::~string((string *)&bofs);
  std::__cxx11::string::string((string *)&bofs,"pos-id.def",(allocator *)&iss);
  create_filename(&pos_id_file,&dicdir,(string *)&bofs);
  std::__cxx11::string::~string((string *)&bofs);
  dic.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lexsize = 0;
  dic.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dic.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fbuf._M_dataplus._M_p = (pointer)&fbuf.field_2;
  fbuf._M_string_length = 0;
  fbuf.field_2._M_local_buf[0] = '\0';
  Param::get<std::__cxx11::string>(&from,param,"dictionary-charset");
  Param::get<std::__cxx11::string>(&to,param,"charset");
  bVar5 = Param::get<bool>(param,"wakati");
  type = Param::get<int>(param,"type");
  Param::get<std::__cxx11::string>(&node_format,param,"node-format");
  iVar7 = Param::get<int>(param,"cost-factor");
  if (iVar7 < 1) {
    poVar12 = std::operator<<((ostream *)&std::cerr,
                              "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                             );
    poVar12 = std::operator<<(poVar12,"(");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x110);
    poVar12 = std::operator<<(poVar12,") [");
    poVar12 = std::operator<<(poVar12,"factor > 0");
    poVar12 = std::operator<<(poVar12,"] ");
    std::operator<<(poVar12,"cost factor needs to be positive value");
    die::~die((die *)&bofs);
  }
  Param::get<std::__cxx11::string>(&config_charset,param,"config-charset");
  if (config_charset._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&config_charset);
  }
  if (from._M_string_length == 0) {
    poVar12 = std::operator<<((ostream *)&std::cerr,
                              "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                             );
    poVar12 = std::operator<<(poVar12,"(");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x118);
    poVar12 = std::operator<<(poVar12,") [");
    poVar12 = std::operator<<(poVar12,"!from.empty()");
    poVar12 = std::operator<<(poVar12,"] ");
    std::operator<<(poVar12,"input dictionary charset is empty");
    die::~die((die *)&bofs);
  }
  if (to._M_string_length == 0) {
    poVar12 = std::operator<<((ostream *)&std::cerr,
                              "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                             );
    poVar12 = std::operator<<(poVar12,"(");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x119);
    poVar12 = std::operator<<(poVar12,") [");
    poVar12 = std::operator<<(poVar12,"!to.empty()");
    poVar12 = std::operator<<(poVar12,"] ");
    std::operator<<(poVar12,"output dictionary charset is empty");
    die::~die((die *)&bofs);
  }
  Iconv::Iconv(&iconv);
  iVar8 = Iconv::open(&iconv,from._M_dataplus._M_p,(int)to._M_dataplus._M_p);
  if ((char)iVar8 == '\0') {
    poVar12 = std::operator<<((ostream *)&std::cerr,
                              "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                             );
    poVar12 = std::operator<<(poVar12,"(");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x11c);
    poVar12 = std::operator<<(poVar12,") [");
    poVar12 = std::operator<<(poVar12,"iconv.open(from.c_str(), to.c_str())");
    poVar12 = std::operator<<(poVar12,"] ");
    poVar12 = std::operator<<(poVar12,"iconv_open() failed with from=");
    poVar12 = std::operator<<(poVar12,(string *)&from);
    poVar12 = std::operator<<(poVar12," to=");
    std::operator<<(poVar12,(string *)&to);
    die::~die((die *)&bofs);
  }
  Iconv::Iconv(&config_iconv);
  iVar8 = Iconv::open(&config_iconv,config_charset._M_dataplus._M_p,(int)from._M_dataplus._M_p);
  if ((char)iVar8 == '\0') {
    poVar12 = std::operator<<((ostream *)&std::cerr,
                              "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                             );
    poVar12 = std::operator<<(poVar12,"(");
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x120);
    poVar12 = std::operator<<(poVar12,") [");
    poVar12 = std::operator<<(poVar12,"config_iconv.open(config_charset.c_str(), from.c_str())");
    poVar12 = std::operator<<(poVar12,"] ");
    poVar12 = std::operator<<(poVar12,"iconv_open() failed with from=");
    poVar12 = std::operator<<(poVar12,(string *)&config_charset);
    poVar12 = std::operator<<(poVar12," to=");
    std::operator<<(poVar12,(string *)&from);
    die::~die((die *)&bofs);
  }
  if (node_format._M_string_length == 0) {
    local_988 = (StringBuffer *)0x0;
    local_998 = (Lattice *)0x0;
    local_9a0 = (Writer *)0x0;
  }
  else {
    local_9a0 = (Writer *)operator_new(0x200);
    Writer::Writer(local_9a0);
    local_998 = createLattice();
    local_988 = (StringBuffer *)operator_new(0x28);
    local_988->_vptr_StringBuffer = (_func_int **)&PTR__StringBuffer_00138f50;
    local_988->ptr_ = (char *)0x0;
    local_988->size_ = 0;
    local_988->alloc_size_ = 0;
    local_988->is_delete_ = true;
    local_988->error_ = false;
    node.wcost = 0;
    node._98_6_ = 0;
    node.cost = 0;
    node.isbest = '\0';
    node._81_3_ = 0;
    node.alpha = 0.0;
    node.beta = 0.0;
    node.prob = 0.0;
    node.id = 0;
    node.length = 0;
    node.rlength = 0;
    node.rcAttr = 0;
    node.lcAttr = 0;
    node.posid = 0;
    node.char_type = '\0';
    node.stat = '\0';
    node.surface = (char *)0x0;
    node.feature = (char *)0x0;
    node.rpath = (mecab_path_t *)0x0;
    node.lpath = (mecab_path_t *)0x0;
    node.enext = (mecab_node_t *)0x0;
    node.bnext = (mecab_node_t *)0x0;
    node.prev = (mecab_node_t *)0x0;
    node.next = (mecab_node_t *)0x0;
  }
  bVar6 = Connector::openText(&matrix,matrix_file._M_dataplus._M_p);
  if ((!bVar6) &&
     (iVar8 = Connector::open(&matrix,matrix_bin_file._M_dataplus._M_p,0x127a70),
     (char)iVar8 == '\0')) {
    matrix.lsize_ = 1;
    matrix.rsize_ = 1;
  }
  p = (POSIDGenerator *)operator_new(0x18);
  (p->rewrite_).super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (p->rewrite_).super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (p->rewrite_).super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scoped_ptr<MeCab::POSIDGenerator>::reset(&posid,p);
  POSIDGenerator::open(posid.ptr_,pos_id_file._M_dataplus._M_p,(int)&config_iconv);
  std::__cxx11::string::string((string *)&bofs,"DEFAULT,0,0,0,*\nSPACE,0,0,0,*\n",(allocator *)&da);
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&bofs,_S_in);
  std::__cxx11::string::~string((string *)&bofs);
  local_9a8 = (CharProperty *)0x0;
  fi = (DecoderFeatureIndex *)0x0;
  uVar19 = 0;
  local_878 = 0;
  do {
    pbVar1 = (dics->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(dics->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar19) {
      if (bVar5) {
        std::__cxx11::string::append((char *)&fbuf,0x128e08);
      }
      ppVar4 = dic.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar3 = dic.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (dic.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          dic.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>
        ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>
                             *)&bofs,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>_>
                                      )dic.
                                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                            (((long)dic.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)dic.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x28 + 1) / 2);
        if (local_708._M_allocated_capacity == 0) {
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,MeCab::Token*>*,std::vector<std::pair<std::__cxx11::string,MeCab::Token*>,std::allocator<std::pair<std::__cxx11::string,MeCab::Token*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<MeCab::(anonymous_namespace)::pair_1st_cmp<std::__cxx11::string,MeCab::Token*>>>
                    (ppVar3,ppVar4);
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,MeCab::Token*>*,std::vector<std::pair<std::__cxx11::string,MeCab::Token*>,std::allocator<std::pair<std::__cxx11::string,MeCab::Token*>>>>,std::pair<std::__cxx11::string,MeCab::Token*>*,long,__gnu_cxx::__ops::_Iter_comp_iter<MeCab::(anonymous_namespace)::pair_1st_cmp<std::__cxx11::string,MeCab::Token*>>>
                    (ppVar3,ppVar4,local_708._M_allocated_capacity,sStack_710);
        }
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>
        ::~_Temporary_buffer
                  ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>
                    *)&bofs);
      }
      prev._M_dataplus._M_p = (pointer)&prev.field_2;
      prev._M_string_length = 0;
      prev.field_2._M_local_buf[0] = '\0';
      str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      len.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      len.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      len.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      lVar21 = 0;
      iVar7 = 0;
      local_978 = (ofstream *)0x0;
      for (uVar19 = 0; poVar2 = local_978,
          uVar19 < (ulong)(((long)dic.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)dic.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x28);
          uVar19 = uVar19 + 1) {
        if ((uVar19 == 0) ||
           (bVar5 = std::operator!=(&prev,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&((dic.
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->first)
                                                  ._M_dataplus._M_p + lVar21)), poVar2 = local_978,
           !bVar5)) {
          iVar7 = iVar7 + 1;
        }
        else {
          _bofs = dic.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)local_978].first._M_dataplus._M_p;
          std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                    ((vector<char_const*,std::allocator<char_const*>> *)&str,(char **)&bofs);
          _bofs = (pointer)dic.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(long)poVar2].first.
                           _M_string_length;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    (&len,(unsigned_long *)&bofs);
          _bofs = iVar7 + (int)local_978 * 0x100;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(&val,(int *)&bofs);
          iVar7 = 1;
          local_978 = (ofstream *)uVar19;
        }
        std::__cxx11::string::_M_assign((string *)&prev);
        lVar21 = lVar21 + 0x28;
      }
      _bofs = dic.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)local_978].first._M_dataplus._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&str,(char **)&bofs);
      _bofs = (pointer)dic.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)poVar2].first.
                       _M_string_length;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&len,(unsigned_long *)&bofs);
      _bofs = iVar7 + (int)local_978 * 0x100;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&val,(int *)&bofs);
      lVar21 = (long)str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (lVar21 != (long)len.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)len.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_start) {
        poVar12 = std::operator<<((ostream *)&std::cerr,
                                  "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                 );
        poVar12 = std::operator<<(poVar12,"(");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x1eb);
        poVar12 = std::operator<<(poVar12,") [");
        poVar12 = std::operator<<(poVar12,"str.size() == len.size()");
        std::operator<<(poVar12,"] ");
        die::~die((die *)&bofs);
        lVar21 = (long)str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
      }
      sVar15 = lVar21 >> 3;
      if (sVar15 != (long)val.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)val.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) {
        poVar12 = std::operator<<((ostream *)&std::cerr,
                                  "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                 );
        poVar12 = std::operator<<(poVar12,"(");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x1ec);
        poVar12 = std::operator<<(poVar12,") [");
        poVar12 = std::operator<<(poVar12,"str.size() == val.size()");
        std::operator<<(poVar12,"] ");
        die::~die((die *)&bofs);
        sVar15 = (long)str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
      }
      da.no_delete_ = false;
      da.error_ = 0;
      da.array_ = (unit_t *)0x0;
      da.used_ = (uchar *)0x0;
      da.size_ = 0;
      da.alloc_size_ = 0;
      iVar7 = Darts::
              DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
              build(&da,sVar15,
                    str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    len.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    val.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,anon_unknown_0::progress_bar_darts);
      if (iVar7 != 0) {
        poVar12 = std::operator<<((ostream *)&std::cerr,
                                  "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                 );
        poVar12 = std::operator<<(poVar12,"(");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x1f0);
        poVar12 = std::operator<<(poVar12,") [");
        poVar12 = std::operator<<(poVar12,
                                  "da.build(str.size(), const_cast<char **>(&str[0]), &len[0], &val[0], &progress_bar_darts) == 0"
                                 );
        poVar12 = std::operator<<(poVar12,"] ");
        std::operator<<(poVar12,"unkown error in building double-array");
        die::~die((die *)&bofs);
      }
      tbuf._M_dataplus._M_p = (pointer)&tbuf.field_2;
      tbuf._M_string_length = 0;
      tbuf.field_2._M_local_buf[0] = '\0';
      lVar21 = 0x20;
      for (uVar19 = 0;
          uVar19 < (ulong)(((long)dic.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)dic.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x28);
          uVar19 = uVar19 + 1) {
        std::__cxx11::string::append
                  ((char *)&tbuf,
                   *(ulong *)((long)&((dic.
                                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->first).
                                     _M_dataplus._M_p + lVar21));
        operator_delete(*(void **)((long)&((dic.
                                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->first).
                                          _M_dataplus._M_p + lVar21));
        lVar21 = lVar21 + 0x28;
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ::clear(&dic);
      while ((tbuf._M_string_length & 7) != 0) {
        _bofs = (pointer)0x0;
        std::__cxx11::string::append((char *)&tbuf,(ulong)&bofs);
      }
      dummy = 0;
      lsize = matrix._32_4_ & 0xffff;
      rsize = (uint)matrix._32_4_ >> 0x10;
      dsize = (int)da.size_ << 3;
      tsize = (uint)tbuf._M_string_length;
      fsize = (uint)fbuf._M_string_length;
      version = 0x66;
      charset[0x10] = '\0';
      charset[0x11] = '\0';
      charset[0x12] = '\0';
      charset[0x13] = '\0';
      charset[0x14] = '\0';
      charset[0x15] = '\0';
      charset[0x16] = '\0';
      charset[0x17] = '\0';
      charset[0x18] = '\0';
      charset[0x19] = '\0';
      charset[0x1a] = '\0';
      charset[0x1b] = '\0';
      charset[0x1c] = '\0';
      charset[0x1d] = '\0';
      charset[0x1e] = '\0';
      charset[0x1f] = '\0';
      charset[0] = '\0';
      charset[1] = '\0';
      charset[2] = '\0';
      charset[3] = '\0';
      charset[4] = '\0';
      charset[5] = '\0';
      charset[6] = '\0';
      charset[7] = '\0';
      charset[8] = '\0';
      charset[9] = '\0';
      charset[10] = '\0';
      charset[0xb] = '\0';
      charset[0xc] = '\0';
      charset[0xd] = '\0';
      charset[0xe] = '\0';
      charset[0xf] = '\0';
      strncpy(charset,to._M_dataplus._M_p,0x1f);
      std::ofstream::ofstream(&bofs,output,_S_out|_S_bin);
      if ((abStack_6f8[*(long *)(_bofs + -0x18)] & 5) != 0) {
        poVar12 = std::operator<<((ostream *)&std::cerr,
                                  "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                 );
        poVar12 = std::operator<<(poVar12,"(");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x20f);
        poVar12 = std::operator<<(poVar12,") [");
        poVar12 = std::operator<<(poVar12,"bofs");
        poVar12 = std::operator<<(poVar12,"] ");
        poVar12 = std::operator<<(poVar12,"permission denied: ");
        std::operator<<(poVar12,output);
        die::~die((die *)&local_970);
      }
      local_970 = 0;
      std::ostream::write((char *)&bofs,(long)&local_970);
      std::ostream::write((char *)&bofs,(long)&version);
      std::ostream::write((char *)&bofs,(long)&type);
      std::ostream::write((char *)&bofs,(long)&lexsize);
      std::ostream::write((char *)&bofs,(long)&lsize);
      std::ostream::write((char *)&bofs,(long)&rsize);
      std::ostream::write((char *)&bofs,(long)&dsize);
      std::ostream::write((char *)&bofs,(long)&tsize);
      std::ostream::write((char *)&bofs,(long)&fsize);
      std::ostream::write((char *)&bofs,(long)&dummy);
      std::ostream::write((char *)&bofs,(long)charset);
      std::ostream::write((char *)&bofs,(long)da.array_);
      std::ostream::write((char *)&bofs,(long)tbuf._M_dataplus._M_p);
      std::ostream::write((char *)&bofs,(long)fbuf._M_dataplus._M_p);
      local_970 = std::ostream::tellp();
      local_970 = local_970 ^ 0xef718f77;
      std::ostream::seekp(&bofs,0,0);
      std::ostream::write((char *)&bofs,(long)&local_970);
      std::ofstream::close();
      std::ofstream::~ofstream(&bofs);
      std::__cxx11::string::~string((string *)&tbuf);
      Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
      clear(&da);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&val.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&len.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                (&str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
      std::__cxx11::string::~string((string *)&prev);
      std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
      Iconv::~Iconv(&config_iconv);
      Iconv::~Iconv(&iconv);
      std::__cxx11::string::~string((string *)&config_charset);
      std::__cxx11::string::~string((string *)&node_format);
      std::__cxx11::string::~string((string *)&to);
      std::__cxx11::string::~string((string *)&from);
      std::__cxx11::string::~string((string *)&fbuf);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ::~vector(&dic);
      std::__cxx11::string::~string((string *)&pos_id_file);
      std::__cxx11::string::~string((string *)&rewrite_file);
      std::__cxx11::string::~string((string *)&right_id_file);
      std::__cxx11::string::~string((string *)&left_id_file);
      std::__cxx11::string::~string((string *)&matrix_bin_file);
      std::__cxx11::string::~string((string *)&matrix_file);
      std::__cxx11::string::~string((string *)&dicdir);
      if (local_9a8 != (CharProperty *)0x0) {
        (*local_9a8->_vptr_CharProperty[1])();
      }
      if (local_988 != (StringBuffer *)0x0) {
        (*local_988->_vptr_StringBuffer[1])(local_988);
      }
      if (local_998 != (Lattice *)0x0) {
        (*local_998->_vptr_Lattice[0x27])();
      }
      if (local_9a0 != (Writer *)0x0) {
        (*local_9a0->_vptr_Writer[1])(local_9a0);
      }
      scoped_ptr<MeCab::ContextID>::~scoped_ptr(&cid);
      if (fi != (DecoderFeatureIndex *)0x0) {
        (*(fi->super_FeatureIndex)._vptr_FeatureIndex[5])(fi);
      }
      scoped_ptr<MeCab::POSIDGenerator>::~scoped_ptr(&posid);
      scoped_ptr<MeCab::DictionaryRewriter>::~scoped_ptr(&rewrite);
      Connector::~Connector(&matrix);
      return true;
    }
    std::ifstream::ifstream(&bofs,pbVar1[uVar19]._M_dataplus._M_p,_S_in);
    local_978 = &bofs;
    if ((abStack_6f8[*(long *)(_bofs + -0x18)] & 5) != 0) {
      if (type == 2) {
        poVar12 = std::operator<<((ostream *)&std::cerr,
                                  (string *)
                                  ((dics->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + uVar19));
        poVar12 = std::operator<<(poVar12," is not found. minimum setting is used.");
        std::endl<char,std::char_traits<char>>(poVar12);
        local_978 = (ofstream *)&iss;
      }
      else {
        poVar12 = std::operator<<((ostream *)&std::cerr,
                                  "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                 );
        poVar12 = std::operator<<(poVar12,"(");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x13e);
        poVar12 = std::operator<<(poVar12,") [");
        poVar12 = std::operator<<(poVar12,"ifs");
        poVar12 = std::operator<<(poVar12,"] ");
        poVar12 = std::operator<<(poVar12,"no such file or directory: ");
        std::operator<<(poVar12,(string *)
                                ((dics->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + uVar19));
        die::~die((die *)&da);
        local_978 = &bofs;
      }
    }
    poVar12 = std::operator<<((ostream *)&std::cout,"reading ");
    poVar12 = std::operator<<(poVar12,(string *)
                                      ((dics->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + uVar19));
    std::operator<<(poVar12," ... ");
    val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)&PTR__scoped_fixed_array_00138e90;
    val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)operator_new__(0x2000);
    val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x2000;
    while( true ) {
      plVar13 = (long *)std::istream::getline
                                  ((char *)local_978,
                                   (long)val.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish);
      str_00 = val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      if ((*(byte *)((long)plVar13 + *(long *)(*plVar13 + -0x18) + 0x20) & 5) != 0) break;
      if (val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish == (pointer)0x0) {
        str_00 = (pointer)0x0;
      }
      else {
        sVar14 = strlen((char *)val.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish);
        if ((sVar14 != 0) && (*(char *)((long)str_00 + (sVar14 - 1)) == '\r')) {
          *(undefined1 *)((long)str_00 + (sVar14 - 1)) = 0;
          str_00 = val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_finish;
        }
      }
      sVar15 = tokenizeCSV<char**>((char *)str_00,(char **)&da,5);
      if (sVar15 != 5) {
        poVar12 = std::operator<<((ostream *)&std::cerr,
                                  "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                 );
        poVar12 = std::operator<<(poVar12,"(");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x158);
        poVar12 = std::operator<<(poVar12,") [");
        poVar12 = std::operator<<(poVar12,"n == 5");
        poVar12 = std::operator<<(poVar12,"] ");
        poVar12 = std::operator<<(poVar12,"format error: ");
        std::operator<<(poVar12,(char *)val.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish);
        die::~die((die *)&prev);
      }
      std::__cxx11::string::string((string *)&tbuf,(char *)da.array_,(allocator *)&prev);
      uVar9 = anon_unknown_0::toInt((char *)da.used_);
      uVar10 = anon_unknown_0::toInt((char *)da.size_);
      iVar11 = anon_unknown_0::toInt((char *)da.alloc_size_);
      std::__cxx11::string::string((string *)charset,(char *)da.key_,(allocator *)&prev);
      iVar8 = POSIDGenerator::id(posid.ptr_,(char *)charset._0_8_);
      if (iVar11 == 0x7fffffff) {
        if (type != 1) {
          poVar12 = std::operator<<((ostream *)&std::cerr,
                                    "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                   );
          poVar12 = std::operator<<(poVar12,"(");
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x162);
          poVar12 = std::operator<<(poVar12,") [");
          poVar12 = std::operator<<(poVar12,"type == MECAB_USR_DIC");
          poVar12 = std::operator<<(poVar12,"] ");
          std::operator<<(poVar12,"cost field should not be empty in sys/unk dic.");
          die::~die((die *)&prev);
        }
        if (rewrite.ptr_ == (DictionaryRewriter *)0x0) {
          pDVar16 = (DictionaryRewriter *)operator_new(0x78);
          (pDVar16->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          p_Var18 = &(pDVar16->cache_)._M_t._M_impl.super__Rb_tree_header;
          (pDVar16->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          (pDVar16->unigram_rewrite_).
          super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
          super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pDVar16->unigram_rewrite_).
          super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
          super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pDVar16->unigram_rewrite_).
          super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
          super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pDVar16->left_rewrite_).
          super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
          super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pDVar16->left_rewrite_).
          super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
          super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pDVar16->left_rewrite_).
          super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
          super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pDVar16->right_rewrite_).
          super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
          super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pDVar16->right_rewrite_).
          super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
          super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pDVar16->right_rewrite_).
          super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
          super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pDVar16->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var18->_M_header;
          (pDVar16->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var18->_M_header;
          (pDVar16->cache_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          scoped_ptr<MeCab::DictionaryRewriter>::reset(&rewrite,pDVar16);
          DictionaryRewriter::open(rewrite.ptr_,rewrite_file._M_dataplus._M_p,(int)&config_iconv);
          this = (DecoderFeatureIndex *)operator_new(0x378);
          DecoderFeatureIndex::DecoderFeatureIndex(this);
          if (fi != (DecoderFeatureIndex *)0x0) {
            (*(fi->super_FeatureIndex)._vptr_FeatureIndex[5])(fi);
          }
          iVar11 = (**(this->super_FeatureIndex)._vptr_FeatureIndex)(this,param);
          if ((char)iVar11 == '\0') {
            poVar12 = std::operator<<((ostream *)&std::cerr,
                                      "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                     );
            poVar12 = std::operator<<(poVar12,"(");
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x168);
            poVar12 = std::operator<<(poVar12,") [");
            poVar12 = std::operator<<(poVar12,"fi->open(param)");
            poVar12 = std::operator<<(poVar12,"] ");
            std::operator<<(poVar12,"cannot open feature index");
            die::~die((die *)&prev);
          }
          this_00 = (CharProperty *)operator_new(0x1d8);
          CharProperty::CharProperty(this_00);
          iVar11 = extraout_EDX;
          if (local_9a8 != (CharProperty *)0x0) {
            (*local_9a8->_vptr_CharProperty[1])();
            iVar11 = extraout_EDX_00;
          }
          iVar11 = CharProperty::open(this_00,(char *)param,iVar11);
          if ((char)iVar11 == '\0') {
            poVar12 = std::operator<<((ostream *)&std::cerr,
                                      "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                     );
            poVar12 = std::operator<<(poVar12,"(");
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x16a);
            poVar12 = std::operator<<(poVar12,") [");
            poVar12 = std::operator<<(poVar12,"property->open(param)");
            std::operator<<(poVar12,"] ");
            die::~die((die *)&prev);
          }
          CharProperty::set_charset(this_00,from._M_dataplus._M_p);
          local_9a8 = this_00;
          fi = this;
        }
        iVar11 = anon_unknown_0::calcCost(&tbuf,(string *)charset,iVar7,fi,rewrite.ptr_,local_9a8);
      }
      if (((uVar10 == 0x7fffffff) || (uVar9 == 0x7fffffff)) || ((int)(uVar10 | uVar9) < 0)) {
        if (rewrite.ptr_ == (DictionaryRewriter *)0x0) {
          pDVar16 = (DictionaryRewriter *)operator_new(0x78);
          (pDVar16->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          p_Var18 = &(pDVar16->cache_)._M_t._M_impl.super__Rb_tree_header;
          (pDVar16->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          (pDVar16->unigram_rewrite_).
          super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
          super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pDVar16->unigram_rewrite_).
          super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
          super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pDVar16->unigram_rewrite_).
          super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
          super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pDVar16->left_rewrite_).
          super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
          super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pDVar16->left_rewrite_).
          super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
          super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pDVar16->left_rewrite_).
          super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
          super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pDVar16->right_rewrite_).
          super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
          super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pDVar16->right_rewrite_).
          super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
          super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pDVar16->right_rewrite_).
          super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
          super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pDVar16->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var18->_M_header;
          (pDVar16->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var18->_M_header;
          (pDVar16->cache_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          scoped_ptr<MeCab::DictionaryRewriter>::reset(&rewrite,pDVar16);
          DictionaryRewriter::open(rewrite.ptr_,rewrite_file._M_dataplus._M_p,(int)&config_iconv);
        }
        prev._M_dataplus._M_p = (pointer)&prev.field_2;
        prev._M_string_length = 0;
        str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        prev.field_2._M_local_buf[0] = '\0';
        str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00
                      );
        len.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&len.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage;
        len.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        len.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)len.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00
                      );
        bVar6 = DictionaryRewriter::rewrite
                          (rewrite.ptr_,(string *)charset,&prev,(string *)&str,(string *)&len);
        if (!bVar6) {
          poVar12 = std::operator<<((ostream *)&std::cerr,
                                    "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                   );
          poVar12 = std::operator<<(poVar12,"(");
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x178);
          poVar12 = std::operator<<(poVar12,") [");
          poVar12 = std::operator<<(poVar12,
                                    "rewrite->rewrite(feature, &ufeature, &lfeature, &rfeature)");
          poVar12 = std::operator<<(poVar12,"] ");
          poVar12 = std::operator<<(poVar12,"rewrite failed: ");
          std::operator<<(poVar12,(string *)charset);
          die::~die((die *)&dummy);
        }
        if (cid.ptr_ == (ContextID *)0x0) {
          this_01 = (ContextID *)operator_new(0xa0);
          ContextID::ContextID(this_01);
          scoped_ptr<MeCab::ContextID>::reset(&cid,this_01);
          ContextID::open(cid.ptr_,left_id_file._M_dataplus._M_p,(int)right_id_file._M_dataplus._M_p
                          ,&config_iconv);
          if ((((cid.ptr_)->left_)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
               (ulong)matrix.lsize_) ||
             (((cid.ptr_)->right_)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
              (ulong)matrix.rsize_)) {
            poVar12 = std::operator<<((ostream *)&std::cerr,
                                      "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                     );
            poVar12 = std::operator<<(poVar12,"(");
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x180);
            poVar12 = std::operator<<(poVar12,") [");
            poVar12 = std::operator<<(poVar12,
                                      "cid->left_size() == matrix.left_size() && cid->right_size() == matrix.right_size()"
                                     );
            poVar12 = std::operator<<(poVar12,"] ");
            poVar12 = std::operator<<(poVar12,"Context ID files(");
            poVar12 = std::operator<<(poVar12,(string *)&left_id_file);
            poVar12 = std::operator<<(poVar12," or ");
            poVar12 = std::operator<<(poVar12,(string *)&right_id_file);
            std::operator<<(poVar12," may be broken");
            die::~die((die *)&dummy);
          }
        }
        uVar9 = ContextID::lid(cid.ptr_,(char *)str.
                                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
        uVar10 = ContextID::rid(cid.ptr_,(char *)len.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::~string((string *)&len);
        std::__cxx11::string::~string((string *)&str);
        std::__cxx11::string::~string((string *)&prev);
        if (-1 < (int)(uVar10 | uVar9)) goto LAB_00115c98;
LAB_00115cb5:
        poVar12 = std::operator<<((ostream *)&std::cerr,
                                  "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                 );
        poVar12 = std::operator<<(poVar12,"(");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x18b);
        poVar12 = std::operator<<(poVar12,") [");
        poVar12 = std::operator<<(poVar12,"lid >= 0 && rid >= 0 && matrix.is_valid(lid, rid)");
        poVar12 = std::operator<<(poVar12,"] ");
        poVar12 = std::operator<<(poVar12,"invalid ids are found lid=");
        poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar9);
        poVar12 = std::operator<<(poVar12," rid=");
        std::ostream::operator<<(poVar12,uVar10);
        die::~die((die *)&prev);
      }
      else {
LAB_00115c98:
        if (((uint)matrix._32_4_ >> 0x10 <= uVar9) || ((matrix._32_4_ & 0xffff) <= uVar10))
        goto LAB_00115cb5;
      }
      pcVar20 = "empty word is found, discard this line";
      if (tbuf._M_string_length == 0) {
LAB_00115fe6:
        poVar12 = std::operator<<((ostream *)&std::cerr,pcVar20);
        std::endl<char,std::char_traits<char>>(poVar12);
      }
      else {
        bVar6 = Iconv::convert(&iconv,(string *)charset);
        pcVar20 = "iconv conversion failed. skip this entry";
        if (!bVar6) goto LAB_00115fe6;
        if (type != 2) {
          bVar6 = Iconv::convert(&iconv,&tbuf);
          pcVar20 = "iconv conversion failed. skip this entry";
          if (!bVar6) goto LAB_00115fe6;
        }
        if (node_format._M_string_length != 0) {
          node.surface = tbuf._M_dataplus._M_p;
          node.feature = (char *)charset._0_8_;
          node.length = (unsigned_short)tbuf._M_string_length;
          node.rlength = (unsigned_short)tbuf._M_string_length;
          node.posid = (unsigned_short)iVar8;
          node._72_8_ = node._72_8_ & 0xffffffffffffff;
          (*local_998->_vptr_Lattice[9])();
          if (local_988 == (StringBuffer *)0x0) {
            poVar12 = std::operator<<((ostream *)&std::cerr,
                                      "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                     );
            poVar12 = std::operator<<(poVar12,"(");
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x1a7);
            poVar12 = std::operator<<(poVar12,") [");
            poVar12 = std::operator<<(poVar12,"os.get()");
            std::operator<<(poVar12,"] ");
            die::~die((die *)&prev);
          }
          if (local_9a0 == (Writer *)0x0) {
            poVar12 = std::operator<<((ostream *)&std::cerr,
                                      "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                     );
            poVar12 = std::operator<<(poVar12,"(");
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x1a8);
            poVar12 = std::operator<<(poVar12,") [");
            poVar12 = std::operator<<(poVar12,"writer.get()");
            std::operator<<(poVar12,"] ");
            die::~die((die *)&prev);
          }
          local_988->size_ = 0;
          node_00 = &node;
          bVar6 = Writer::writeNode(local_9a0,local_998,node_format._M_dataplus._M_p,node_00,
                                    local_988);
          __buf = extraout_RDX;
          if (!bVar6) {
            poVar12 = std::operator<<((ostream *)&std::cerr,
                                      "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                                     );
            poVar12 = std::operator<<(poVar12,"(");
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,0x1ac);
            poVar12 = std::operator<<(poVar12,") [");
            poVar12 = std::operator<<(poVar12,
                                      "writer->writeNode(lattice.get(), node_format.c_str(), &node, &*os)"
                                     );
            poVar12 = std::operator<<(poVar12,"] ");
            poVar12 = std::operator<<(poVar12,"conversion error: ");
            poVar12 = std::operator<<(poVar12,(string *)charset);
            poVar12 = std::operator<<(poVar12," with ");
            std::operator<<(poVar12,(string *)&node_format);
            die::~die((die *)&prev);
            __buf = extraout_RDX_00;
          }
          StringBuffer::write(local_988,0,__buf,(size_t)node_00);
          std::__cxx11::string::assign(charset);
        }
        str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00
                      );
        if (!bVar5) {
          std::operator+(&prev,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               charset,'\0');
          std::__cxx11::string::operator=((string *)&str,(string *)&prev);
          std::__cxx11::string::~string((string *)&prev);
        }
        puVar17 = (undefined2 *)operator_new(0x10);
        *puVar17 = (short)uVar9;
        puVar17[1] = (short)uVar10;
        puVar17[2] = (unsigned_short)iVar8;
        puVar17[3] = (short)iVar11;
        *(int *)(puVar17 + 4) = (int)local_878;
        *(undefined4 *)(puVar17 + 6) = 0;
        std::__cxx11::string::string((string *)&prev,(string *)&tbuf);
        std::
        vector<std::pair<std::__cxx11::string,MeCab::Token*>,std::allocator<std::pair<std::__cxx11::string,MeCab::Token*>>>
        ::emplace_back<std::pair<std::__cxx11::string,MeCab::Token*>>
                  ((vector<std::pair<std::__cxx11::string,MeCab::Token*>,std::allocator<std::pair<std::__cxx11::string,MeCab::Token*>>>
                    *)&dic,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>
                            *)&prev);
        std::__cxx11::string::~string((string *)&prev);
        if (!bVar5) {
          std::__cxx11::string::append
                    ((char *)&fbuf,
                     (ulong)str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
        }
        local_878 = local_878 +
                    (long)str.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
        lexsize = lexsize + 1;
        std::__cxx11::string::~string((string *)&str);
      }
      std::__cxx11::string::~string((string *)charset);
      std::__cxx11::string::~string((string *)&tbuf);
    }
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar12);
    scoped_fixed_array<char,_8192>::~scoped_fixed_array((scoped_fixed_array<char,_8192> *)&val);
    std::ifstream::~ifstream(&bofs);
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

bool Dictionary::compile(const Param &param,
                         const std::vector<std::string> &dics,
                         const char *output) {
  Connector matrix;
  scoped_ptr<DictionaryRewriter> rewrite;
  scoped_ptr<POSIDGenerator> posid;
  scoped_ptr<DecoderFeatureIndex> fi;
  scoped_ptr<ContextID> cid;
  scoped_ptr<Writer> writer;
  scoped_ptr<Lattice> lattice;
  scoped_ptr<StringBuffer> os;
  scoped_ptr<CharProperty> property;
  Node node;

  const std::string dicdir = param.get<std::string>("dicdir");

  const std::string matrix_file     = DCONF(MATRIX_DEF_FILE);
  const std::string matrix_bin_file = DCONF(MATRIX_FILE);
  const std::string left_id_file    = DCONF(LEFT_ID_FILE);
  const std::string right_id_file   = DCONF(RIGHT_ID_FILE);
  const std::string rewrite_file    = DCONF(REWRITE_FILE);
  const std::string pos_id_file     = DCONF(POS_ID_FILE);

  std::vector<std::pair<std::string, Token*> > dic;

  size_t offset  = 0;
  unsigned int lexsize = 0;
  std::string fbuf;

  const std::string from = param.get<std::string>("dictionary-charset");
  const std::string to = param.get<std::string>("charset");
  const bool wakati = param.get<bool>("wakati");
  const int type = param.get<int>("type");
  const std::string node_format = param.get<std::string>("node-format");
  const int factor = param.get<int>("cost-factor");
  CHECK_DIE(factor > 0)   << "cost factor needs to be positive value";

  // for backward compatibility
  std::string config_charset = param.get<std::string>("config-charset");
  if (config_charset.empty()) {
    config_charset = from;
  }

  CHECK_DIE(!from.empty()) << "input dictionary charset is empty";
  CHECK_DIE(!to.empty())   << "output dictionary charset is empty";

  Iconv iconv;
  CHECK_DIE(iconv.open(from.c_str(), to.c_str()))
      << "iconv_open() failed with from=" << from << " to=" << to;

  Iconv config_iconv;
  CHECK_DIE(config_iconv.open(config_charset.c_str(), from.c_str()))
      << "iconv_open() failed with from=" << config_charset << " to=" << from;

  if (!node_format.empty()) {
    writer.reset(new Writer);
    lattice.reset(createLattice());
    os.reset(new StringBuffer);
    memset(&node, 0, sizeof(node));
  }

  if (!matrix.openText(matrix_file.c_str()) &&
      !matrix.open(matrix_bin_file.c_str())) {
    matrix.set_left_size(1);
    matrix.set_right_size(1);
  }

  posid.reset(new POSIDGenerator);
  posid->open(pos_id_file.c_str(), &config_iconv);

  std::istringstream iss(UNK_DEF_DEFAULT);

  for (size_t i = 0; i < dics.size(); ++i) {
    std::ifstream ifs(WPATH(dics[i].c_str()));
    std::istream *is = &ifs;
    if (!ifs) {
      if (type == MECAB_UNK_DIC) {
        std::cerr << dics[i]
                  << " is not found. minimum setting is used." << std::endl;
        is = &iss;
      } else {
        CHECK_DIE(ifs) << "no such file or directory: " << dics[i];
      }
    }

    std::cout << "reading " << dics[i] << " ... ";

    scoped_fixed_array<char, BUF_SIZE> line;
    size_t num = 0;

    while (is->getline(line.get(), line.size())) {
#if 1 /* for Open JTalk */
      {
        /* if there is CR code, it should be removed */
        char *tmpstr = line.get();
        if(tmpstr != NULL){
          size_t tmplen = strlen(tmpstr);
          if(tmplen > 0){
            if(tmpstr[tmplen-1] == '\r'){
              tmpstr[tmplen-1] = '\0';
            }
          }
        }
      }
#endif
      char *col[8];
      const size_t n = tokenizeCSV(line.get(), col, 5);
      CHECK_DIE(n == 5) << "format error: " << line.get();

      std::string w = col[0];
      int lid = toInt(col[1]);
      int rid = toInt(col[2]);
      int cost = toInt(col[3]);
      std::string feature = col[4];
      const int pid = posid->id(feature.c_str());

      if (cost == INT_MAX) {
        CHECK_DIE(type == MECAB_USR_DIC)
            << "cost field should not be empty in sys/unk dic.";
        if (!rewrite.get()) {
          rewrite.reset(new DictionaryRewriter);
          rewrite->open(rewrite_file.c_str(), &config_iconv);
          fi.reset(new DecoderFeatureIndex);
          CHECK_DIE(fi->open(param)) << "cannot open feature index";
          property.reset(new CharProperty);
          CHECK_DIE(property->open(param));
          property->set_charset(from.c_str());
        }
        cost = calcCost(w, feature, factor,
                        fi.get(), rewrite.get(), property.get());
      }

      if (lid < 0  || rid < 0 || lid == INT_MAX || rid == INT_MAX) {
        if (!rewrite.get()) {
          rewrite.reset(new DictionaryRewriter);
          rewrite->open(rewrite_file.c_str(), &config_iconv);
        }

        std::string ufeature, lfeature, rfeature;
        CHECK_DIE(rewrite->rewrite(feature, &ufeature, &lfeature, &rfeature))
            << "rewrite failed: " << feature;

        if (!cid.get()) {
          cid.reset(new ContextID);
          cid->open(left_id_file.c_str(),
                    right_id_file.c_str(), &config_iconv);
          CHECK_DIE(cid->left_size()  == matrix.left_size() &&
                    cid->right_size() == matrix.right_size())
              << "Context ID files("
              << left_id_file
              << " or "
              << right_id_file << " may be broken";
        }

        lid = cid->lid(lfeature.c_str());
        rid = cid->rid(rfeature.c_str());
      }

      CHECK_DIE(lid >= 0 && rid >= 0 && matrix.is_valid(lid, rid))
          << "invalid ids are found lid=" << lid << " rid=" << rid;

      if (w.empty()) {
        std::cerr << "empty word is found, discard this line" << std::endl;
        continue;
      }

      if (!iconv.convert(&feature)) {
        std::cerr << "iconv conversion failed. skip this entry"
                  << std::endl;
        continue;
      }

      if (type != MECAB_UNK_DIC && !iconv.convert(&w)) {
        std::cerr << "iconv conversion failed. skip this entry"
                  << std::endl;
        continue;
      }

      if (!node_format.empty()) {
        node.surface = w.c_str();
        node.feature = feature.c_str();
        node.length  = w.size();
        node.rlength = w.size();
        node.posid   = pid;
        node.stat    = MECAB_NOR_NODE;
        lattice->set_sentence(w.c_str());
        CHECK_DIE(os.get());
        CHECK_DIE(writer.get());
        os->clear();
        CHECK_DIE(writer->writeNode(lattice.get(),
                                    node_format.c_str(),
                                    &node, &*os)) <<
            "conversion error: " << feature << " with " << node_format;
        *os << '\0';
        feature = os->str();
      }

      std::string key;
      if (!wakati) {
        key = feature + '\0';
      }

      Token* token  = new Token;
      token->lcAttr = lid;
      token->rcAttr = rid;
      token->posid  = pid;
      token->wcost = cost;
      token->feature = offset;
      token->compound = 0;
      dic.push_back(std::pair<std::string, Token*>(w, token));

      // append to output buffer
      if (!wakati) {
        fbuf.append(key.data(), key.size());
      }
      offset += key.size();

      ++num;
      ++lexsize;
    }

    std::cout << num << std::endl;
  }

  if (wakati) {
    fbuf.append("\0", 1);
  }

  std::stable_sort(dic.begin(), dic.end(),
                   pair_1st_cmp<std::string, Token *>());

  size_t bsize = 0;
  size_t idx = 0;
  std::string prev;
  std::vector<const char *> str;
  std::vector<size_t> len;
  std::vector<Darts::DoubleArray::result_type> val;

  for (size_t i = 0; i < dic.size(); ++i) {
    if (i != 0 && prev != dic[i].first) {
      str.push_back(dic[idx].first.c_str());
      len.push_back(dic[idx].first.size());
      val.push_back(bsize +(idx << 8));
      bsize = 1;
      idx = i;
    } else {
      ++bsize;
    }
    prev = dic[i].first;
  }
  str.push_back(dic[idx].first.c_str());
  len.push_back(dic[idx].first.size());
  val.push_back(bsize +(idx << 8));

  CHECK_DIE(str.size() == len.size());
  CHECK_DIE(str.size() == val.size());

  Darts::DoubleArray da;
  CHECK_DIE(da.build(str.size(), const_cast<char **>(&str[0]),
                     &len[0], &val[0], &progress_bar_darts) == 0)
      << "unkown error in building double-array";

  std::string tbuf;
  for (size_t i = 0; i < dic.size(); ++i) {
    tbuf.append(reinterpret_cast<const char*>(dic[i].second),
                sizeof(Token));
    delete dic[i].second;
  }
  dic.clear();

  // needs to be 8byte(64bit) aligned
  while (tbuf.size() % 8 != 0) {
    Token dummy;
    memset(&dummy, 0, sizeof(Token));
    tbuf.append(reinterpret_cast<const char*>(&dummy), sizeof(Token));
  }

  unsigned int dummy = 0;
  unsigned int lsize = matrix.left_size();
  unsigned int rsize = matrix.right_size();
  unsigned int dsize = da.unit_size() * da.size();
  unsigned int tsize = tbuf.size();
  unsigned int fsize = fbuf.size();

  unsigned int version = DIC_VERSION;
  char charset[32];
  std::fill(charset, charset + sizeof(charset), '\0');
  std::strncpy(charset, to.c_str(), 31);

  std::ofstream bofs(WPATH(output), std::ios::binary|std::ios::out);
  CHECK_DIE(bofs) << "permission denied: " << output;

  unsigned int magic = 0;

  // needs to be 64bit aligned
  // 10*32 = 64*5
  bofs.write(reinterpret_cast<const char *>(&magic),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&version), sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&type),    sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&lexsize), sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&lsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&rsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&dsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&tsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&fsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&dummy),   sizeof(unsigned int));

  // 32 * 8 = 64 * 4
  bofs.write(reinterpret_cast<const char *>(charset),  sizeof(charset));

  bofs.write(reinterpret_cast<const char*>(da.array()),
             da.unit_size() * da.size());
  bofs.write(const_cast<const char *>(tbuf.data()), tbuf.size());
  bofs.write(const_cast<const char *>(fbuf.data()), fbuf.size());

  // save magic id
  magic = static_cast<unsigned int>(bofs.tellp());
  magic ^= DictionaryMagicID;
  bofs.seekp(0);
  bofs.write(reinterpret_cast<const char *>(&magic), sizeof(unsigned int));

  bofs.close();

  return true;
}